

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O0

bool Diligent::ValidateResourceViewDimension<Diligent::IBufferView>
               (char *ResName,Uint32 ArraySize,Uint32 ArrayInd,IBufferView *pViewImpl,
               RESOURCE_DIMENSION ExpectedResourceDim,bool IsMultisample)

{
  int iVar1;
  undefined4 extraout_var;
  Char *pCVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Uint32 ArrayIndex;
  String *pSVar4;
  char (*in_stack_fffffffffffffe78) [49];
  char (*in_stack_fffffffffffffe98) [2];
  String local_110;
  undefined1 local_f0 [8];
  string msg_2;
  undefined1 local_b0 [8];
  string msg_1;
  Char *pCStack_88;
  Uint32 SampleCount;
  Char *local_70;
  String local_68;
  undefined1 local_48 [8];
  string msg;
  RESOURCE_DIMENSION ResourceDim;
  bool BindingsOK;
  bool IsMultisample_local;
  RESOURCE_DIMENSION ExpectedResourceDim_local;
  IBufferView *pViewImpl_local;
  Uint32 ArrayInd_local;
  Uint32 ArraySize_local;
  char *ResName_local;
  char *pcVar3;
  
  msg.field_2._M_local_buf[0xd] = '\x01';
  if (ExpectedResourceDim != RESOURCE_DIM_UNDEFINED) {
    pcVar3 = ResName;
    msg.field_2._M_local_buf[0xe] = IsMultisample;
    msg.field_2._M_local_buf[0xf] = ExpectedResourceDim;
    msg.field_2._M_local_buf[0xc] = GetResourceViewDimension(pViewImpl);
    ArrayIndex = (Uint32)pcVar3;
    if (msg.field_2._M_local_buf[0xc] != msg.field_2._M_local_buf[0xf]) {
      iVar1 = (*(pViewImpl->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      GetShaderResourcePrintName_abi_cxx11_
                (&local_68,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
      local_70 = GetResourceDimString(msg.field_2._M_local_buf[0xc]);
      pCStack_88 = GetResourceDimString(msg.field_2._M_local_buf[0xf]);
      in_stack_fffffffffffffe78 = (char (*) [49])&local_70;
      pSVar4 = &local_68;
      FormatString<char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
                ((string *)local_48,(Diligent *)"The dimension of resource view \'",
                 (char (*) [33])CONCAT44(extraout_var,iVar1),(char **)"\' bound to variable \'",
                 (char (*) [22])pSVar4,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\' is ",
                 (char (*) [6])in_stack_fffffffffffffe78,
                 (char **)", but resource dimension expected by the shader is ",
                 (char (*) [52])&stack0xffffffffffffff78,(char **)0x48e286,in_stack_fffffffffffffe98
                );
      ArrayIndex = (Uint32)pSVar4;
      std::__cxx11::string::~string((string *)&local_68);
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"ValidateResourceViewDimension",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x177);
      std::__cxx11::string::~string((string *)local_48);
      msg.field_2._M_local_buf[0xd] = '\0';
    }
    if ((msg.field_2._M_local_buf[0xc] == '\x04') || (msg.field_2._M_local_buf[0xc] == '\x05')) {
      msg_1.field_2._12_4_ = GetResourceSampleCount(pViewImpl);
      if (((msg.field_2._M_local_buf[0xe] & 1U) == 0) || (msg_1.field_2._12_4_ != 1)) {
        if (((msg.field_2._M_local_buf[0xe] & 1U) == 0) && (1 < (uint)msg_1.field_2._12_4_)) {
          iVar1 = (*(pViewImpl->super_IDeviceObject).super_IObject._vptr_IObject[4])();
          GetShaderResourcePrintName_abi_cxx11_
                    (&local_110,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
          FormatString<char[15],char_const*,char[22],std::__cxx11::string,char[49]>
                    ((string *)local_f0,(Diligent *)"Texture view \'",
                     (char (*) [15])CONCAT44(extraout_var_01,iVar1),
                     (char **)"\' bound to variable \'",(char (*) [22])&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "\' is invalid: single-sample texture is expected.",in_stack_fffffffffffffe78);
          std::__cxx11::string::~string((string *)&local_110);
          pCVar2 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar2,"ValidateResourceViewDimension",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                     ,0x187);
          std::__cxx11::string::~string((string *)local_f0);
          msg.field_2._M_local_buf[0xd] = '\0';
        }
      }
      else {
        iVar1 = (*(pViewImpl->super_IDeviceObject).super_IObject._vptr_IObject[4])();
        pSVar4 = (String *)((long)&msg_2.field_2 + 8);
        GetShaderResourcePrintName_abi_cxx11_
                  (pSVar4,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
        FormatString<char[15],char_const*,char[22],std::__cxx11::string,char[47]>
                  ((string *)local_b0,(Diligent *)"Texture view \'",
                   (char (*) [15])CONCAT44(extraout_var_00,iVar1),(char **)"\' bound to variable \'"
                   ,(char (*) [22])pSVar4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\' is invalid: multisample texture is expected.",
                   (char (*) [47])in_stack_fffffffffffffe78);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"ValidateResourceViewDimension",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x181);
        std::__cxx11::string::~string((string *)local_b0);
        msg.field_2._M_local_buf[0xd] = '\0';
      }
    }
  }
  return (bool)(msg.field_2._M_local_buf[0xd] & 1);
}

Assistant:

bool ValidateResourceViewDimension(const char*                ResName,
                                   Uint32                     ArraySize,
                                   Uint32                     ArrayInd,
                                   const TextureViewImplType* pViewImpl,
                                   RESOURCE_DIMENSION         ExpectedResourceDim,
                                   bool                       IsMultisample)
{
    bool BindingsOK = true;

    if (ExpectedResourceDim != RESOURCE_DIM_UNDEFINED)
    {
        const RESOURCE_DIMENSION ResourceDim = GetResourceViewDimension(pViewImpl);
        if (ResourceDim != ExpectedResourceDim)
        {
            RESOURCE_VALIDATION_FAILURE("The dimension of resource view '", pViewImpl->GetDesc().Name,
                                        "' bound to variable '", GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is ", GetResourceDimString(ResourceDim),
                                        ", but resource dimension expected by the shader is ", GetResourceDimString(ExpectedResourceDim), ".");
            BindingsOK = false;
        }

        if (ResourceDim == RESOURCE_DIM_TEX_2D || ResourceDim == RESOURCE_DIM_TEX_2D_ARRAY)
        {
            Uint32 SampleCount = GetResourceSampleCount(pViewImpl);
            if (IsMultisample && SampleCount == 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: multisample texture is expected.");
                BindingsOK = false;
            }
            else if (!IsMultisample && SampleCount > 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: single-sample texture is expected.");
                BindingsOK = false;
            }
        }
    }

    return BindingsOK;
}